

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O1

ptr<buffer> __thiscall nuraft::srv_config::serialize(srv_config *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int32 *in_RSI;
  ptr<buffer> pVar1;
  
  buffer::alloc((buffer *)this,*(long *)(in_RSI + 4) + *(long *)(in_RSI + 0xc) + 0xf);
  buffer::put(*(buffer **)this,*in_RSI);
  buffer::put(*(buffer **)this,in_RSI[1]);
  buffer::put(*(buffer **)this,(string *)(in_RSI + 2));
  buffer::put(*(buffer **)this,(string *)(in_RSI + 10));
  buffer::put(*(buffer **)this,(byte)in_RSI[0x12]);
  buffer::put(*(buffer **)this,in_RSI[0x13]);
  buffer::pos(*(buffer **)this,0);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> srv_config::serialize() const{
    ptr<buffer> buf = buffer::alloc(
        sz_int +
        sz_int +
        (endpoint_.length()+1) +
        (aux_.length()+1) +
        1 +
        sz_int
    );
    buf->put(id_);
    buf->put(dc_id_);
    buf->put(endpoint_);
    buf->put(aux_);
    buf->put((byte)(learner_?(1):(0)));
    buf->put(priority_);
    buf->pos(0);
    return buf;
}